

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpillPointers.cpp
# Opt level: O2

void __thiscall wasm::SpillPointers::spillPointers(SpillPointers *this)

{
  int iVar1;
  Function *this_00;
  BasicBlock *pBVar2;
  long lVar3;
  __node_base _Var4;
  pointer puVar5;
  uint uVar6;
  size_t sVar7;
  Type TVar8;
  mapped_type *pmVar9;
  size_type sVar10;
  size_type sVar11;
  mapped_type *pppEVar12;
  long lVar13;
  __node_base_ptr p_Var14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [8];
  __node_base_ptr p_Var18;
  undefined1 local_f0 [8];
  PointerMap pointerMap;
  undefined1 auStack_98 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> toSpill;
  undefined1 local_60 [8];
  SetOfLocals live;
  key_type local_3c;
  uint local_38;
  uint index;
  
  this_00 = (this->
            super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
            ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
            super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
            .super_PostWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
            super_Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
            currFunction;
  live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&this->pointerType;
  (this->pointerType).id =
       *(uintptr_t *)
        ((long)(((((this->
                   super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                   ).
                   super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                   .
                   super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                   .super_PostWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                   .super_Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
                  currModule)->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t + 0x50);
  local_f0 = (undefined1  [8])&pointerMap._M_h._M_rehash_policy._M_next_resize;
  pointerMap._M_h._M_buckets = (__buckets_ptr)0x1;
  pointerMap._M_h._M_bucket_count = 0;
  pointerMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  pointerMap._M_h._M_element_count._0_4_ = 0x3f800000;
  pointerMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  pointerMap._M_h._M_rehash_policy._4_4_ = 0;
  pointerMap._M_h._M_rehash_policy._M_next_resize = 0;
  uVar6 = 0;
  while( true ) {
    local_60._0_4_ = uVar6;
    sVar7 = Function::getNumLocals(this_00);
    if (sVar7 <= uVar6) break;
    TVar8 = Function::getLocalType(this_00,local_60._0_4_);
    _Var4 = pointerMap._M_h._M_before_begin;
    if (TVar8.id ==
        *(uintptr_t *)
         live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      uVar6 = wasm::Type::getByteSize
                        ((Type *)live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      pmVar9 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)local_f0,(key_type *)local_60);
      *pmVar9 = uVar6 * (int)_Var4._M_nxt;
    }
    uVar6 = local_60._0_4_ + 1;
  }
  p_Var18 = (__node_base_ptr)
            (this->
            super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
            ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
            super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
            .basicBlocks.
            super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var14 = *(__node_base_ptr *)
             ((long)&(this->
                     super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                     ).
                     super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                     .
                     super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                     .basicBlocks.
                     super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
                     ._M_impl.super__Vector_impl_data + 8);
  local_38 = 0;
  index = 0xffffffff;
  pointerMap._M_h._M_single_bucket = p_Var14;
  do {
    if (p_Var18 == p_Var14) {
      if ((local_38 & 1) != 0) {
        uVar6 = wasm::Type::getByteSize
                          ((Type *)live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
        ABI::getStackSpace(index,this_00,uVar6 * (int)pointerMap._M_h._M_before_begin._M_nxt,
                           (this->
                           super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                           ).
                           super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                           .
                           super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                           .
                           super_PostWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                           .
                           super_Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                           .currModule);
      }
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_f0);
      return;
    }
    local_60 = (undefined1  [8])
               (((__uniq_ptr_data<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>,_true,_true>
                  *)&p_Var18->_M_nxt)->
               super___uniq_ptr_impl<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
               )._M_t.
               super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
               .
               super__Head_base<0UL,_wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_false>
               ._M_head_impl;
    sVar10 = std::
             _Hashtable<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->
                      super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                      ).
                      super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                      .liveBlocks._M_h,(key_type *)local_60);
    if (sVar10 != 0) {
      pBVar2 = (((__uniq_ptr_data<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>,_true,_true>
                  *)&p_Var18->_M_nxt)->
               super___uniq_ptr_impl<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
               )._M_t.
               super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock>_>
               .
               super__Head_base<0UL,_wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_false>
               ._M_head_impl;
      lVar13 = *(long *)&(pBVar2->contents).actions.
                         super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                         ._M_impl;
      uVar16 = 0xffffffffffffffff;
      for (uVar6 = 0; uVar15 = (ulong)uVar6,
          uVar15 < (ulong)(((long)*(pointer *)((long)&(pBVar2->contents).actions + 8) - lVar13) /
                          0x18); uVar6 = uVar6 + 1) {
        uVar16 = uVar16 & 0xffffffff;
        if (*(int *)(lVar13 + uVar15 * 0x18) == 2) {
          uVar16 = uVar15;
        }
      }
      if ((int)uVar16 != -1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,
                   &(pBVar2->contents).end.super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                  );
        uVar16 = ((long)*(pointer *)((long)&(pBVar2->contents).actions + 8) -
                 *(long *)&(pBVar2->contents).actions.
                           super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                           ._M_impl) / 0x18 & 0xffffffff;
LAB_00bdc8ab:
        uVar15 = uVar16 & 0xffffffff;
        lVar13 = uVar16 * 0x18;
        do {
          puVar5 = live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar16 = uVar16 - 1;
          if ((int)uVar15 < 1) {
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
            p_Var14 = pointerMap._M_h._M_single_bucket;
            break;
          }
          lVar3 = *(long *)&(pBVar2->contents).actions.
                            super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                            ._M_impl;
          iVar1 = *(int *)(lVar3 + -0x18 + lVar13);
          if (iVar1 == 0) {
            SortedVector::insert((SortedVector *)local_60,*(Index *)(lVar3 + -0x14 + lVar13));
          }
          else {
            if (iVar1 != 1) goto LAB_00bdc901;
            SortedVector::erase((SortedVector *)local_60,*(Index *)(lVar3 + -0x14 + lVar13));
          }
          uVar15 = (ulong)((int)uVar15 - 1);
          lVar13 = lVar13 + -0x18;
        } while( true );
      }
    }
    p_Var18 = p_Var18 + 1;
  } while( true );
LAB_00bdc901:
  if (iVar1 != 2) {
    handle_unreachable("unexpected action",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SpillPointers.cpp"
                       ,0x8f);
  }
  toSpill.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_98 = (undefined1  [8])0x0;
  toSpill.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  for (auVar17 = local_60; auVar17 != (undefined1  [8])puVar5;
      auVar17 = (undefined1  [8])
                ((long)&(((BasicBlock *)auVar17)->contents).start.
                        super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start + 4)) {
    local_3c = *(key_type *)
                &(((BasicBlock *)auVar17)->contents).start.
                 super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
    sVar11 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)local_f0,&local_3c);
    if (sVar11 != 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_98,&local_3c);
    }
  }
  if (auStack_98 !=
      (undefined1  [8])
      toSpill.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    if ((local_38 & 1) == 0) {
      index = Builder::addVar(this_00,(Type)*(uintptr_t *)
                                             live.
                                             super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                                             .
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_38 = (uint)CONCAT71((uint7)(uint3)(index >> 8),1);
    }
    pppEVar12 = std::__detail::
                _Map_base<wasm::Expression_**,_std::pair<wasm::Expression_**const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Expression_**const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_**>,_std::hash<wasm::Expression_**>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Expression_**,_std::pair<wasm::Expression_**const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Expression_**const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_**>,_std::hash<wasm::Expression_**>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->actualPointers,(key_type *)(lVar3 + -0x10 + lVar13));
    spillPointersAroundCall
              (this,*pppEVar12,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_98,
               index,(PointerMap *)local_f0,this_00,
               (this->
               super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
               ).
               super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
               super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
               .super_PostWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
               super_Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
               currModule);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_98);
  goto LAB_00bdc8ab;
}

Assistant:

void spillPointers() {
    pointerType = getModule()->memories[0]->addressType;

    // we only care about possible pointers
    auto* func = getFunction();
    PointerMap pointerMap;
    for (Index i = 0; i < func->getNumLocals(); i++) {
      if (func->getLocalType(i) == pointerType) {
        auto offset = pointerMap.size() * pointerType.getByteSize();
        pointerMap[i] = offset;
      }
    }
    // find calls and spill around them
    bool spilled = false;
    Index spillLocal = -1;
    for (auto& curr : basicBlocks) {
      if (liveBlocks.count(curr.get()) == 0) {
        continue; // ignore dead blocks
      }
      auto& liveness = curr->contents;
      auto& actions = liveness.actions;
      Index lastCall = -1;
      for (Index i = 0; i < actions.size(); i++) {
        auto& action = liveness.actions[i];
        if (action.isOther()) {
          lastCall = i;
        }
      }
      if (lastCall == Index(-1)) {
        continue; // nothing to see here
      }
      // scan through the block, spilling around the calls
      // TODO: we can filter on pointerMap everywhere
      SetOfLocals live = liveness.end;
      for (int i = int(actions.size()) - 1; i >= 0; i--) {
        auto& action = actions[i];
        if (action.isGet()) {
          live.insert(action.index);
        } else if (action.isSet()) {
          live.erase(action.index);
        } else if (action.isOther()) {
          std::vector<Index> toSpill;
          for (auto index : live) {
            if (pointerMap.count(index) > 0) {
              toSpill.push_back(index);
            }
          }
          if (!toSpill.empty()) {
            // we now have a call + the information about which locals
            // should be spilled
            if (!spilled) {
              // prepare stack support: get a pointer to stack space big enough
              // for all our data
              spillLocal = Builder::addVar(func, pointerType);
              spilled = true;
            }
            // the origin was seen at walk, but the thing may have moved
            auto* pointer = actualPointers[action.origin];
            spillPointersAroundCall(
              pointer, toSpill, spillLocal, pointerMap, func, getModule());
          }
        } else {
          WASM_UNREACHABLE("unexpected action");
        }
      }
    }
    if (spilled) {
      // get the stack space, and set the local to it
      ABI::getStackSpace(spillLocal,
                         func,
                         pointerType.getByteSize() * pointerMap.size(),
                         *getModule());
    }
  }